

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O2

void __thiscall CTcSymObjBase::build_dictionary(CTcSymObjBase *this)

{
  CTcVocabEntry *pCVar1;
  CTcVocabEntry **ppCVar2;
  
  if ((this->dict_ != (CTcDictEntry *)0x0) && ((this->field_0xb8 & 0x20) == 0)) {
    inherit_vocab(this);
    ppCVar2 = &this->vocab_;
    while (pCVar1 = *ppCVar2, pCVar1 != (CTcVocabEntry *)0x0) {
      CTcDictEntry::add_word
                (this->dict_,pCVar1->txt_,pCVar1->len_,0,this->obj_id_,(uint)pCVar1->prop_);
      ppCVar2 = &pCVar1->nxt_;
    }
  }
  return;
}

Assistant:

void CTcSymObjBase::build_dictionary()
{
    CTcVocabEntry *entry;

    /* if I don't have a dictionary, there's nothing to do */
    if (dict_ == 0)
        return;

    /* 
     *   if I'm a class, there's nothing to do, since vocabulary defined in a
     *   class is only entered in the dictionary for the instances of the
     *   class, not for the class itself 
     */
    if (is_class_)
        return;

    /* add inherited words from my superclasses to my list */
    inherit_vocab();

    /* add each of my words to the dictionary */
    for (entry = vocab_ ; entry != 0 ; entry = entry->nxt_)
    {
        /* add this word to my dictionary */
        dict_->add_word(entry->txt_, entry->len_, FALSE,
                        obj_id_, entry->prop_);
    }
}